

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O0

void __thiscall tst_helpers_connect::rejectTwoSendersDestroyed(tst_helpers_connect *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  Object *pOVar4;
  int local_80 [3];
  bool local_72;
  bool local_71;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  PromiseFromSignal<void_(Object::*)()> p;
  undefined1 local_30 [8];
  Object *s1;
  Object *local_18;
  Object *s0;
  tst_helpers_connect *this_local;
  
  s0 = (Object *)this;
  pOVar4 = (Object *)operator_new(0x18);
  *(undefined8 *)pOVar4 = 0;
  *(undefined8 *)&pOVar4->field_0x8 = 0;
  *(undefined8 *)&pOVar4->m_connections = 0;
  Object::Object(pOVar4);
  local_18 = pOVar4;
  pOVar4 = (Object *)operator_new(0x18);
  *(undefined8 *)pOVar4 = 0;
  *(undefined8 *)&pOVar4->field_0x8 = 0;
  *(undefined8 *)&pOVar4->m_connections = 0;
  Object::Object(pOVar4);
  p.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)local_30;
  local_30 = (undefined1  [8])pOVar4;
  QtPromisePrivate::qtpromise_defer<tst_helpers_connect::rejectTwoSendersDestroyed()::__0>
            ((type *)&p.super_QPromiseBase<void>.m_d);
  local_60 = Object::noArgSignal;
  local_58 = 0;
  local_70 = Object::twoArgsSignal;
  local_68 = 0;
  QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(int,QString_const&)>
            ((Object *)local_50,(offset_in_Object_to_subr)local_18,(Object *)Object::noArgSignal,0);
  local_71 = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_50);
  local_72 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_71,&local_72,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0xd3);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_80[1] = 0xffffffff;
    local_80[0] = 0x2a;
    iVar3 = waitForValue<int>((QPromise<void> *)local_50,local_80 + 1,local_80);
    bVar2 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1, 42)","42",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                            ,0xd4);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      local_80[2] = 0;
    }
    else {
      local_80[2] = 1;
    }
  }
  else {
    local_80[2] = 1;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_50);
  return;
}

Assistant:

void tst_helpers_connect::rejectTwoSendersDestroyed()
{
    auto s0 = new Object{};
    auto s1 = new Object{};

    QtPromisePrivate::qtpromise_defer([&]() {
        QObject::connect(s1, &QObject::destroyed, [&]() {
            // Let's first delete s1, then resolve s0 and make sure
            // we don't reject when the rejecter object is destroyed.
            Q_EMIT s0->noArgSignal();
        });

        s1->deleteLater();
    });

    auto p = QtPromise::connect(s0, &Object::noArgSignal, s1, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1, 42), 42);
}